

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O2

int AF_A_SerpentHumpDecide(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  FState *pFVar4;
  AActor *this_00;
  char *__assertion;
  FSoundID local_20;
  FName local_1c;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00542c3b;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_00542c2b;
  this_00 = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_00542ad0;
    bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00542c3b;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_00542c2b;
LAB_00542ad0:
    this_00 = (AActor *)0x0;
  }
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_00542c2b:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_00542c3b;
      }
      this = (DObject *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if ((this != (DObject *)0x0) &&
           (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00542c3b;
        }
      }
      else if (this != (DObject *)0x0) goto LAB_00542c2b;
    }
    if (((2 < (uint)numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) &&
       ((VVar1 != '\x03' ||
        ((param[2].field_0.field_1.atag != 8 && (param[2].field_0.field_1.a != (void *)0x0)))))) {
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_00542c3b:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x59,
                    "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  pFVar4 = this_00->MissileState;
  iVar3 = FRandom::operator()(&pr_serpenthump);
  if (pFVar4 == (FState *)0x0) {
    if (3 < iVar3) {
      return 0;
    }
  }
  else {
    if (0x1e < iVar3) {
      return 0;
    }
    iVar3 = FRandom::operator()(&pr_serpenthump);
    if (iVar3 < 0x28) goto LAB_00542bb8;
  }
  bVar2 = AActor::CheckMeleeRange(this_00);
  if (bVar2) {
    return 0;
  }
  if ((this_00->MissileState == (FState *)0x0) ||
     (iVar3 = FRandom::operator()(&pr_serpenthump), 0x7f < iVar3)) {
    FName::FName(&local_1c,"Hump");
    pFVar4 = AActor::FindState(this_00,&local_1c);
    AActor::SetState(this_00,pFVar4,false);
    local_20.ID = S_FindSound("SerpentActive");
    S_Sound(this_00,4,&local_20,1.0,1.0);
    return 0;
  }
LAB_00542bb8:
  AActor::SetState(this_00,this_00->MeleeState,false);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentHumpDecide)
{
	PARAM_ACTION_PROLOGUE;

	if (self->MissileState != NULL)
	{
		if (pr_serpenthump() > 30)
		{
			return 0;
		}
		else if (pr_serpenthump() < 40)
		{ // Missile attack
			self->SetState (self->MeleeState);
			return 0;
		}
	}
	else if (pr_serpenthump() > 3)
	{
		return 0;
	}
	if (!self->CheckMeleeRange ())
	{ // The hump shouldn't occur when within melee range
		if (self->MissileState != NULL && pr_serpenthump() < 128)
		{
			self->SetState (self->MeleeState);
		}
		else
		{	
			self->SetState (self->FindState ("Hump"));
			S_Sound (self, CHAN_BODY, "SerpentActive", 1, ATTN_NORM);
		}
	}
	return 0;
}